

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

void mbedtls_mpi_free(mbedtls_mpi *X)

{
  long lVar1;
  long lVar2;
  mbedtls_mpi_uint *__ptr;
  
  if (X != (mbedtls_mpi *)0x0) {
    __ptr = X->p;
    if (__ptr != (mbedtls_mpi_uint *)0x0) {
      lVar1 = X->n << 3;
      if (lVar1 != 0) {
        lVar2 = 0;
        do {
          *(undefined1 *)((long)__ptr + lVar2) = 0;
          lVar2 = lVar2 + 1;
        } while (lVar1 != lVar2);
        __ptr = X->p;
      }
      free(__ptr);
    }
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
  }
  return;
}

Assistant:

void mbedtls_mpi_free( mbedtls_mpi *X )
{
    if( X == NULL )
        return;

    if( X->p != NULL )
    {
        mbedtls_zeroize( X->p, X->n * ciL );
        mbedtls_free( X->p );
    }

    X->s = 1;
    X->n = 0;
    X->p = NULL;
}